

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O0

UStringPrepProfile * __thiscall
icu_63::LocalMemory<UStringPrepProfile>::allocateInsteadAndReset
          (LocalMemory<UStringPrepProfile> *this,int32_t newCapacity)

{
  UStringPrepProfile *p;
  int32_t newCapacity_local;
  LocalMemory<UStringPrepProfile> *this_local;
  
  if (newCapacity < 1) {
    this_local = (LocalMemory<UStringPrepProfile> *)0x0;
  }
  else {
    this_local = (LocalMemory<UStringPrepProfile> *)uprv_malloc_63((long)newCapacity << 7);
    if ((UStringPrepProfile *)this_local != (UStringPrepProfile *)0x0) {
      memset(this_local,0,(long)newCapacity << 7);
      uprv_free_63((this->super_LocalPointerBase<UStringPrepProfile>).ptr);
      (this->super_LocalPointerBase<UStringPrepProfile>).ptr = (UStringPrepProfile *)this_local;
    }
  }
  return (UStringPrepProfile *)this_local;
}

Assistant:

inline T *LocalMemory<T>::allocateInsteadAndReset(int32_t newCapacity) {
    if(newCapacity>0) {
        T *p=(T *)uprv_malloc(newCapacity*sizeof(T));
        if(p!=NULL) {
            uprv_memset(p, 0, newCapacity*sizeof(T));
            uprv_free(LocalPointerBase<T>::ptr);
            LocalPointerBase<T>::ptr=p;
        }
        return p;
    } else {
        return NULL;
    }
}